

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[7],kj::String&,char,kj::StringPtr&,kj::String&,char_const(&)[22],kj::CappedArray<char,17ul>,char_const(&)[10],unsigned_int,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [7],String *params_1,
          char *params_2,StringPtr *params_3,String *params_4,char (*params_5) [22],
          CappedArray<char,_17UL> *params_6,char (*params_7) [10],uint *params_8,
          char (*params_9) [4])

{
  char (*value) [7];
  String *pSVar1;
  char *value_00;
  StringPtr *value_01;
  char (*value_02) [22];
  CappedArray<char,_17UL> *value_03;
  char (*value_04) [10];
  uint *value_05;
  char (*value_06) [4];
  ArrayPtr<const_char> *in_stack_ffffffffffffff00;
  ArrayPtr<const_char> local_e8;
  CappedArray<char,_14UL> local_d8;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  char local_69 [1];
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  String *local_48;
  String *params_local_4;
  StringPtr *params_local_3;
  char *params_local_2;
  String *params_local_1;
  char (*params_local) [7];
  
  local_48 = (String *)params_3;
  params_local_4 = (String *)params_2;
  params_local_3 = (StringPtr *)params_1;
  params_local_2 = *params;
  params_local_1 = (String *)this;
  params_local = (char (*) [7])__return_storage_ptr__;
  value = ::const((char (*) [7])this);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[7]>(value);
  pSVar1 = fwd<kj::String&>((String *)params_local_2);
  local_68 = _::toStringTreeOrCharSequence<kj::String&>(pSVar1);
  value_00 = fwd<char>((NoInfer<char> *)params_local_3);
  local_69[0] = (char)_::toStringTreeOrCharSequence<char>(value_00);
  value_01 = fwd<kj::StringPtr&>((StringPtr *)params_local_4);
  local_80 = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_01);
  pSVar1 = fwd<kj::String&>(local_48);
  local_90 = _::toStringTreeOrCharSequence<kj::String&>(pSVar1);
  value_02 = ::const((char (*) [22])params_4);
  local_a0 = _::toStringTreeOrCharSequence<char_const(&)[22]>(value_02);
  value_03 = fwd<kj::CappedArray<char,17ul>>((NoInfer<kj::CappedArray<char,_17UL>_> *)params_5);
  local_b0 = _::toStringTreeOrCharSequence<kj::CappedArray<char,17ul>>(value_03);
  value_04 = ::const((char (*) [10])params_6);
  local_c0 = _::toStringTreeOrCharSequence<char_const(&)[10]>(value_04);
  value_05 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_7);
  _::toStringTreeOrCharSequence<unsigned_int>(&local_d8,value_05);
  value_06 = ::const((char (*) [4])params_8);
  local_e8 = _::toStringTreeOrCharSequence<char_const(&)[4]>(value_06);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_58,&local_68,
             (ArrayPtr<const_char> *)local_69,(FixedArray<char,_1UL> *)&local_80,&local_90,&local_a0
             ,&local_b0,&local_c0,(ArrayPtr<const_char> *)&local_d8,
             (CappedArray<char,_14UL> *)&local_e8,in_stack_ffffffffffffff00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}